

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strcspn(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  uint uVar2;
  sxi32 sVar3;
  char *pcVar4;
  char *pcVar5;
  jx9_value *pjVar6;
  ulong uVar7;
  int iVar8;
  anon_union_8_3_18420de5_for_x aVar9;
  int iLen;
  int iMasklen;
  char *zString;
  SyString sToken;
  int local_50;
  uint local_4c;
  char *local_48;
  SyString local_40;
  
  if (1 < nArg) {
    pcVar4 = jx9_value_to_string(*apArg,&local_50);
    local_48 = pcVar4;
    pcVar5 = jx9_value_to_string(apArg[1],(int *)&local_4c);
    if (0 < (long)local_50) {
      if ((int)local_4c < 1) {
        pjVar6 = pCtx->pRet;
        jx9MemObjRelease(pjVar6);
        (pjVar6->x).iVal = (long)local_50;
        goto LAB_00131ea2;
      }
      if (nArg == 2) {
LAB_00131ec4:
        sVar3 = ExtractNonSpaceToken(&local_48,pcVar4 + local_50,&local_40);
        if (local_40.nByte == 0 || sVar3 != 0) {
          aVar9.rVal = 0.0;
        }
        else {
          pcVar4 = local_40.zString;
          if (0 < (int)local_40.nByte) {
            do {
              if (0 < (int)local_4c) {
                uVar7 = 0;
                do {
                  if (*pcVar4 == pcVar5[uVar7]) goto LAB_00131f2a;
                  uVar7 = uVar7 + 1;
                } while (local_4c != uVar7);
              }
              pcVar4 = pcVar4 + 1;
            } while (pcVar4 < local_40.zString + (int)local_40.nByte);
          }
LAB_00131f2a:
          aVar9 = (anon_union_8_3_18420de5_for_x)(long)((int)pcVar4 - (int)local_40.zString);
        }
        pjVar6 = pCtx->pRet;
        jx9MemObjRelease(pjVar6);
        pjVar6->x = aVar9;
        goto LAB_00131ea2;
      }
      pjVar6 = apArg[2];
      jx9MemObjToInteger(pjVar6);
      uVar1 = (uint)(pjVar6->x).iVal;
      if ((int)uVar1 < 0) {
        uVar2 = local_50 + uVar1;
        if (uVar2 != 0 && SCARRY4(local_50,uVar1) == (int)uVar2 < 0) {
          iVar8 = -uVar1;
          goto LAB_00131e5b;
        }
      }
      else {
        iVar8 = local_50 - uVar1;
        if (iVar8 != 0 && (int)uVar1 <= local_50) {
          uVar2 = uVar1 & 0x7fffffff;
LAB_00131e5b:
          pcVar4 = pcVar4 + uVar2;
          local_50 = iVar8;
          local_48 = pcVar4;
          if (3 < (uint)nArg) {
            pjVar6 = apArg[3];
            jx9MemObjToInteger(pjVar6);
            iVar8 = (int)(pjVar6->x).iVal;
            if (iVar8 < local_50 && 0 < iVar8) {
              local_50 = iVar8;
            }
          }
          goto LAB_00131ec4;
        }
      }
    }
  }
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
LAB_00131ea2:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_strcspn(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zMask, *zEnd;
	int iMasklen, iLen;
	SyString sToken;
	int iCount = 0;
	int rc;
	if( nArg < 2 ){
		/* Missing agruments, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &iLen);
	/* Extract the mask */
	zMask = jx9_value_to_string(apArg[1], &iMasklen);
	if( iLen < 1 ){
		/* Nothing to process, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( iMasklen < 1 ){
		/* No given mask, return the string length */
		jx9_result_int(pCtx, iLen);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 ){
			const char *zBase = &zString[iLen + nOfft];
			if( zBase > zString ){
				iLen = (int)(&zString[iLen]-zBase);
				zString = zBase;	
			}else{
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}
		}else{
			if( nOfft >= iLen ){
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}else{
				/* Update offset */
				zString += nOfft;
				iLen -= nOfft;
			}
		}
		if( nArg > 3 ){
			int iUserlen;
			/* Extract the desired length */
			iUserlen = jx9_value_to_int(apArg[3]);
			if( iUserlen > 0 && iUserlen < iLen ){
				iLen = iUserlen;
			}
		}
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	/* Extract the first non-space token */
	rc = ExtractNonSpaceToken(&zString, zEnd, &sToken);
	if( rc == SXRET_OK && sToken.nByte > 0 ){
		/* Compare against the current mask */
		iCount = LongestStringMask2(sToken.zString, (int)sToken.nByte, zMask, iMasklen);
	}
	/* Longest match */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}